

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_number.c
# Opt level: O1

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/cJSON/tests/print_number.c"
            );
  UnityDefaultTestRun(print_number_should_print_zero,"print_number_should_print_zero",0x75);
  UnityDefaultTestRun(print_number_should_print_negative_integers,
                      "print_number_should_print_negative_integers",0x76);
  UnityDefaultTestRun(print_number_should_print_positive_integers,
                      "print_number_should_print_positive_integers",0x77);
  UnityDefaultTestRun(print_number_should_print_positive_reals,
                      "print_number_should_print_positive_reals",0x78);
  UnityDefaultTestRun(print_number_should_print_negative_reals,
                      "print_number_should_print_negative_reals",0x79);
  UnityDefaultTestRun(print_number_should_print_non_number,"print_number_should_print_non_number",
                      0x7a);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item */
    UNITY_BEGIN();

    RUN_TEST(print_number_should_print_zero);
    RUN_TEST(print_number_should_print_negative_integers);
    RUN_TEST(print_number_should_print_positive_integers);
    RUN_TEST(print_number_should_print_positive_reals);
    RUN_TEST(print_number_should_print_negative_reals);
    RUN_TEST(print_number_should_print_non_number);

    return UNITY_END();
}